

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = *(int *)(in_RDI + 8) + -1;
  *(int *)(in_RDI + 8) = iVar1;
  cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8));
  GenericTypeHandler<google::protobuf::Message>::Clear((Message *)0x421994);
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  TypeHandler::Clear(cast<TypeHandler>(rep_->elements[--current_size_]));
}